

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_test_listener.cc
# Opt level: O3

void __thiscall HttpTestListener::HttpTestListener(HttpTestListener *this,int port)

{
  _Rb_tree_header *p_Var1;
  http_parser *phVar2;
  
  (this->request_url_)._M_dataplus._M_p = (pointer)&(this->request_url_).field_2;
  (this->request_url_)._M_string_length = 0;
  (this->request_url_).field_2._M_local_buf[0] = '\0';
  (this->request_body_)._M_dataplus._M_p = (pointer)&(this->request_body_).field_2;
  (this->request_body_)._M_string_length = 0;
  (this->request_body_).field_2._M_local_buf[0] = '\0';
  (this->response_body_)._M_dataplus._M_p = (pointer)&(this->response_body_).field_2;
  (this->response_body_)._M_string_length = 0;
  (this->response_body_).field_2._M_local_buf[0] = '\0';
  (this->request_method_)._M_dataplus._M_p = (pointer)&(this->request_method_).field_2;
  (this->request_method_)._M_string_length = 0;
  (this->request_method_).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->map_request_query_)._M_t._M_impl.super__Rb_tree_header;
  (this->map_request_query_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->map_request_query_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->map_request_query_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->map_request_query_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->map_request_query_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->map_request_header_)._M_t._M_impl.super__Rb_tree_header;
  (this->map_request_header_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->map_request_header_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->map_request_header_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->map_request_header_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->map_request_header_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->map_response_header_)._M_t._M_impl.super__Rb_tree_header;
  (this->map_response_header_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->map_response_header_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->map_response_header_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->map_response_header_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->map_response_header_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->last_request_field_)._M_dataplus._M_p = (pointer)&(this->last_request_field_).field_2;
  (this->last_request_field_)._M_string_length = 0;
  (this->last_request_field_).field_2._M_local_buf[0] = '\0';
  (this->last_request_value_)._M_dataplus._M_p = (pointer)&(this->last_request_value_).field_2;
  (this->last_request_value_)._M_string_length = 0;
  (this->last_request_value_).field_2._M_local_buf[0] = '\0';
  this->response_status_code_ = 200;
  this->is_request_complete_ = false;
  this->is_last_value_ = false;
  this->local_port_ = port;
  phVar2 = (http_parser *)calloc(1,0x20);
  this->parser_ = phVar2;
  return;
}

Assistant:

HttpTestListener::HttpTestListener(int port) {
  response_status_code_ = 200;
  is_request_complete_ = false;
  is_last_value_ = false;
  this->local_port_ = port;
  this->parser_ = (http_parser*)calloc(1, sizeof(http_parser));
}